

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_h_predictor_32x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  __m128i left_col_8p;
  uint8_t local_28;
  uint8_t uStack_27;
  uint8_t uStack_26;
  uint8_t uStack_25;
  uint8_t uStack_24;
  uint8_t uStack_23;
  uint8_t uStack_22;
  uint8_t uStack_21;
  uint8_t uStack_20;
  uint8_t uStack_1f;
  uint8_t uStack_1e;
  uint8_t uStack_1d;
  uint8_t uStack_1c;
  uint8_t uStack_1b;
  uint8_t uStack_1a;
  uint8_t uStack_19;
  
  local_28 = *left;
  uStack_26 = left[1];
  uStack_24 = left[2];
  uStack_22 = left[3];
  uStack_20 = left[4];
  uStack_1e = left[5];
  uStack_1c = left[6];
  uStack_1a = left[7];
  uStack_27 = local_28;
  uStack_25 = uStack_26;
  uStack_23 = uStack_24;
  uStack_21 = uStack_22;
  uStack_1f = uStack_20;
  uStack_1d = uStack_1e;
  uStack_1b = uStack_1c;
  uStack_19 = uStack_1a;
  h_prediction_32x8_1((__m128i *)&local_28,dst,stride);
  h_prediction_32x8_2((__m128i *)&local_28,dst + stride * 4,stride);
  return;
}

Assistant:

void aom_h_predictor_32x8_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  __m128i left_col, left_col_8p;
  (void)above;

  left_col = _mm_load_si128((const __m128i *)left);

  left_col_8p = _mm_unpacklo_epi8(left_col, left_col);
  h_prediction_32x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_32x8_2(&left_col_8p, dst, stride);
}